

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::SampleDepthCase::renderPattern(SampleDepthCase *this)

{
  GLenum GVar1;
  int i;
  uint uVar2;
  float fVar3;
  float fVar4;
  Vec3 pt2;
  Vec3 pt1;
  Vec3 pt0;
  undefined1 *local_64;
  float local_5c;
  float local_58;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  
  glwClearColor(0.0,0.0,0.0,0.0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClearColor(0.0f, 0.0f, 0.0f, 0.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x438);
  glwClearDepthf(1.0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClearDepthf(1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x439);
  glwClear(0x4100);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x43a);
  uVar2 = 0;
  do {
    if ((uVar2 & 1) == 0) {
      local_64 = &DAT_3f8000003f800000;
      local_5c = 1.0;
    }
    else {
      local_64 = (undefined1 *)0x0;
      local_5c = 0.0;
    }
    local_58 = 1.0;
    fVar4 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
            ((float)(int)uVar2 * 6.2831855) / 50.0;
    fVar3 = cosf(fVar4 + 0.0);
    local_3c.m_data[1] = sinf(fVar4 + 0.0);
    local_3c.m_data[1] = local_3c.m_data[1] * 3.0;
    local_3c.m_data[2] = 1.0;
    local_3c.m_data[0] = fVar3 * 3.0;
    fVar3 = cosf(fVar4 + 2.0943952);
    local_48.m_data[1] = sinf(fVar4 + 2.0943952);
    local_48.m_data[1] = local_48.m_data[1] * 3.0;
    local_48.m_data[2] = 0.0;
    local_48.m_data[0] = fVar3 * 3.0;
    fVar3 = cosf(fVar4 + 4.1887903);
    local_54.m_data[1] = sinf(fVar4 + 4.1887903);
    local_54.m_data[1] = local_54.m_data[1] * 3.0;
    local_54.m_data[2] = 0.0;
    local_54.m_data[0] = fVar3 * 3.0;
    MultisampleCase::renderTriangle
              ((MultisampleCase *)this,&local_3c,&local_48,&local_54,(Vec4 *)&local_64,
               (Vec4 *)&local_64,(Vec4 *)&local_64);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x32);
  return;
}

Assistant:

void SampleDepthCase::renderPattern (void) const
{
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 0.0f));
	GLU_CHECK_CALL(glClearDepthf(1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT));

	{
		const int numPolygons = 50;

		for (int i = 0; i < numPolygons; i++)
		{
			Vec4	color	= i % 2 == 0 ? Vec4(1.0f, 1.0f, 1.0f, 1.0f) : Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			float	angle	= 2.0f * DE_PI * (float)i / (float)numPolygons + 0.001f*(float)m_currentIteration;
			Vec3	pt0		(3.0f*deFloatCos(angle + 2.0f*DE_PI*0.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*0.0f/3.0f), 1.0f);
			Vec3	pt1		(3.0f*deFloatCos(angle + 2.0f*DE_PI*1.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*1.0f/3.0f), 0.0f);
			Vec3	pt2		(3.0f*deFloatCos(angle + 2.0f*DE_PI*2.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*2.0f/3.0f), 0.0f);

			renderTriangle(pt0, pt1, pt2, color);
		}
	}
}